

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

bool __thiscall
duckdb::
QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::timestamp_t>_>_>
::operator()(QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::timestamp_t>_>_>
             *this,INPUT_TYPE *lhs,INPUT_TYPE *rhs)

{
  DataChunk *pDVar1;
  MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t> *pMVar2;
  CURSOR *pCVar3;
  ulong uVar4;
  reference pvVar5;
  ulong uVar6;
  bool bVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  bool bVar15;
  RESULT_TYPE RVar16;
  RESULT_TYPE RVar17;
  INPUT_TYPE local_38;
  
  pMVar2 = this->accessor_l->outer;
  pCVar3 = this->accessor_l->inner->data;
  uVar4 = *lhs;
  uVar6 = (pCVar3->scan).current_row_index;
  if ((pCVar3->scan).next_row_index <= uVar4 || uVar4 < uVar6) {
    pDVar1 = &pCVar3->page;
    ColumnDataCollection::Seek(pCVar3->inputs,uVar4,&pCVar3->scan,pDVar1);
    pvVar5 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
    pCVar3->data = (timestamp_t *)pvVar5->data;
    pvVar5 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
    FlatVector::VerifyFlatVector(pvVar5);
    pCVar3->validity = &pvVar5->validity;
    uVar6 = (pCVar3->scan).current_row_index;
  }
  local_38.value = pCVar3->data[(uint)((int)uVar4 - (int)uVar6)].value;
  RVar16 = MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>::operator()
                     (pMVar2,&local_38);
  lVar10 = RVar16.micros;
  pMVar2 = this->accessor_r->outer;
  pCVar3 = this->accessor_r->inner->data;
  uVar4 = *rhs;
  uVar6 = (pCVar3->scan).current_row_index;
  if ((pCVar3->scan).next_row_index <= uVar4 || uVar4 < uVar6) {
    pDVar1 = &pCVar3->page;
    ColumnDataCollection::Seek(pCVar3->inputs,uVar4,&pCVar3->scan,pDVar1);
    pvVar5 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
    pCVar3->data = (timestamp_t *)pvVar5->data;
    pvVar5 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
    FlatVector::VerifyFlatVector(pvVar5);
    pCVar3->validity = &pvVar5->validity;
    uVar6 = (pCVar3->scan).current_row_index;
  }
  local_38.value = pCVar3->data[(uint)((int)uVar4 - (int)uVar6)].value;
  RVar17 = MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>::operator()
                     (pMVar2,&local_38);
  lVar12 = RVar17.micros;
  lVar11 = RVar16._0_8_ >> 0x20;
  lVar13 = RVar17._0_8_ >> 0x20;
  if (this->desc == true) {
    lVar11 = lVar11 + lVar10 / 86400000000;
    lVar8 = (long)RVar16.months + lVar11 / 0x1e;
    lVar13 = lVar13 + lVar12 / 86400000000;
    lVar9 = (long)RVar17.months + lVar13 / 0x1e;
    if (lVar9 < lVar8) {
      return true;
    }
    if (lVar8 < lVar9) {
      return false;
    }
    lVar10 = lVar10 % 86400000000;
    lVar11 = lVar11 % 0x1e;
    lVar12 = lVar12 % 86400000000;
    lVar13 = lVar13 % 0x1e;
    if (lVar13 < lVar11) {
      return true;
    }
    bVar7 = lVar13 <= lVar11;
    bVar15 = SBORROW8(lVar10,lVar12);
    lVar13 = lVar10 - lVar12;
    bVar14 = lVar10 == lVar12;
  }
  else {
    lVar13 = lVar13 + lVar12 / 86400000000;
    lVar9 = (long)RVar17.months + lVar13 / 0x1e;
    lVar11 = lVar11 + lVar10 / 86400000000;
    lVar8 = (long)RVar16.months + lVar11 / 0x1e;
    if (lVar8 < lVar9) {
      return true;
    }
    if (lVar9 < lVar8) {
      return false;
    }
    lVar12 = lVar12 % 86400000000;
    lVar13 = lVar13 % 0x1e;
    lVar10 = lVar10 % 86400000000;
    lVar11 = lVar11 % 0x1e;
    if (lVar11 < lVar13) {
      return true;
    }
    bVar7 = lVar11 <= lVar13;
    bVar15 = SBORROW8(lVar12,lVar10);
    lVar13 = lVar12 - lVar10;
    bVar14 = lVar12 == lVar10;
  }
  return (bool)((!bVar14 && bVar15 == lVar13 < 0) & bVar7);
}

Assistant:

inline bool operator()(const INPUT_TYPE &lhs, const INPUT_TYPE &rhs) const {
		const auto lval = accessor_l(lhs);
		const auto rval = accessor_r(rhs);

		return desc ? (rval < lval) : (lval < rval);
	}